

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::FieldOptions::SerializeWithCachedSizesToArray(FieldOptions *this,uint8 *target)

{
  bool bVar1;
  int32 value;
  string *str;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  uint uVar3;
  uint8 *puVar4;
  Type *this_00;
  int i;
  int index;
  
  uVar3 = this->_has_bits_[0];
  if ((uVar3 & 1) != 0) {
    value = this->ctype_;
    *target = '\b';
    target = io::CodedOutputStream::WriteVarint32SignExtendedToArray(value,target + 1);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 2) != 0) {
    bVar1 = this->packed_;
    *target = '\x10';
    target = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,target + 1);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 8) != 0) {
    bVar1 = this->deprecated_;
    *target = '\x18';
    target = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,target + 1);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 4) != 0) {
    bVar1 = this->lazy_;
    *target = '(';
    target = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,target + 1);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 0x10) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->experimental_map_key_->_M_dataplus)._M_p,
               (int)this->experimental_map_key_->_M_string_length,SERIALIZE);
    str = this->experimental_map_key_;
    *target = 'J';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray((uint32)str->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(str,puVar4);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 0x20) != 0) {
    bVar1 = this->weak_;
    *target = 'P';
    target = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,target + 1);
  }
  for (index = 0; index < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      index = index + 1) {
    this_00 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                        (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
    target[0] = 0xba;
    target[1] = '>';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(this_00->_cached_size_,target + 2);
    target = UninterpretedOption::SerializeWithCachedSizesToArray(this_00,puVar4);
  }
  puVar4 = internal::ExtensionSet::SerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,target);
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,puVar4);
    return puVar4;
  }
  return puVar4;
}

Assistant:

::google::protobuf::uint8* FieldOptions::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
  if (has_ctype()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->ctype(), target);
  }

  // optional bool packed = 2;
  if (has_packed()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->packed(), target);
  }

  // optional bool deprecated = 3 [default = false];
  if (has_deprecated()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(3, this->deprecated(), target);
  }

  // optional bool lazy = 5 [default = false];
  if (has_lazy()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(5, this->lazy(), target);
  }

  // optional string experimental_map_key = 9;
  if (has_experimental_map_key()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->experimental_map_key().data(), this->experimental_map_key().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        9, this->experimental_map_key(), target);
  }

  // optional bool weak = 10 [default = false];
  if (has_weak()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(10, this->weak(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.SerializeWithCachedSizesToArray(
      1000, 536870912, target);

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}